

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  uchar *puVar8;
  float *pfVar9;
  stbi__result_info *in_R9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  double dVar16;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar6 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar4 = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar6,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar11 = 0;
        uVar5 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar13 = b * a;
        uVar12 = 0;
        if (0 < (int)uVar5) {
          uVar12 = (ulong)uVar5;
        }
        lVar7 = (long)req_comp;
        puVar8 = __ptr;
        pfVar9 = pfVar2;
        uVar14 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar14 = uVar11;
        }
        for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            dVar16 = pow((double)((float)puVar8[uVar10] / 255.0),(double)stbi__l2h_gamma);
            pfVar9[uVar10] = (float)((double)stbi__l2h_scale * dVar16);
          }
          puVar8 = puVar8 + lVar7;
          pfVar9 = pfVar9 + lVar7;
        }
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar5;
          while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar7;
          }
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      pcVar4 = "outofmem";
    }
    *(char **)(in_FS_OFFSET + -0x10) = pcVar4;
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar2 != (float *)0x0) {
      iVar1 = stbi__vertically_flip_on_load_global;
      if (*(int *)(in_FS_OFFSET + -4) != 0) {
        iVar1 = *(int *)(in_FS_OFFSET + -8);
      }
      if (iVar1 != 0) {
        if (req_comp == 0) {
          req_comp = *comp;
        }
        stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}